

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::WriteDependencies
          (cmDependsFortran *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *param_3,ostream *param_4)

{
  int iVar1;
  cmFortranSourceInfo *info;
  ostream *poVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  char *m1;
  cmFortranParser parser;
  undefined1 local_178 [328];
  
  m1 = "Cannot scan dependencies without a source file.";
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var3 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     p_Var3[1]._M_parent != (_Base_ptr)0x0)) {
    if (obj->_M_string_length != 0) {
      bVar4 = true;
      for (; (_Rb_tree_header *)p_Var3 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        info = cmDependsFortranInternals::CreateObjectInfo
                         (this->Internal,(obj->_M_dataplus)._M_p,*(char **)(p_Var3 + 1));
        cmFortranParser_s::cmFortranParser_s
                  ((cmFortranParser_s *)local_178,&(this->super_cmDepends).IncludePath,
                   &this->PPDefinitions,info);
        cmFortranParser_FilePush((cmFortranParser_s *)local_178,*(char **)(p_Var3 + 1));
        iVar1 = cmFortran_yyparse((yyscan_t)local_178._24_8_);
        if (iVar1 != 0) {
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "warning: failed to parse dependencies from Fortran source \'");
          poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
          poVar2 = std::operator<<(poVar2,"\': ");
          poVar2 = std::operator<<(poVar2,(string *)(local_178 + 0x90));
          std::endl<char,std::char_traits<char>>(poVar2);
          bVar4 = false;
        }
        cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)local_178);
      }
      return bVar4;
    }
    m1 = "Cannot scan dependencies without an object file.";
  }
  cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
  return false;
}

Assistant:

bool cmDependsFortran::WriteDependencies(const std::set<std::string>& sources,
                                         const std::string& obj,
                                         std::ostream& /*makeDepends*/,
                                         std::ostream& /*internalDepends*/)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  bool okay = true;
  for (std::set<std::string>::const_iterator it = sources.begin();
       it != sources.end(); ++it) {
    const std::string& src = *it;
    // Get the information object for this source.
    cmFortranSourceInfo& info =
      this->Internal->CreateObjectInfo(obj.c_str(), src.c_str());

    // Create the parser object. The constructor takes info by reference,
    // so we may look into the resulting objects later.
    cmFortranParser parser(this->IncludePath, this->PPDefinitions, info);

    // Push on the starting file.
    cmFortranParser_FilePush(&parser, src.c_str());

    // Parse the translation unit.
    if (cmFortran_yyparse(parser.Scanner) != 0) {
      // Failed to parse the file.  Report failure to write dependencies.
      okay = false;
      /* clang-format off */
      std::cerr <<
        "warning: failed to parse dependencies from Fortran source "
        "'" << src << "': " << parser.Error << std::endl
        ;
      /* clang-format on */
    }
  }
  return okay;
}